

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  cmState *this_01;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  ostringstream w;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1f0 = linkLanguage;
  TVar2 = cmGeneratorTarget::GetType(tgt);
  if (TVar2 == EXECUTABLE) {
    this_01 = cmStateSnapshot::GetState(&this->StateSnapshot);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"TARGET_SUPPORTS_SHARED_LIBS","");
    bVar1 = cmState::GetGlobalPropertyAsBool(this_01,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
    return __return_storage_ptr__;
  }
  PVar3 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,CMP0065);
  switch(PVar3) {
  case OLD:
    break;
  case WARN:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      this_00 = this->Makefile;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"CMAKE_POLICY_WARNING_CMP0065","");
      bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar1 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_218,(cmPolicies *)0x41,id_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                 ,0xa0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_218,
                          &this->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_1a8,(cmPolicies *)0x41,id);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_1a8,
                        &this->DirectoryBacktrace);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  case NEW:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ENABLE_EXPORTS","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    break;
  default:
    goto switchD_0030f578_default;
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_SHARED_LIBRARY_LINK_","");
  std::__cxx11::string::_M_append(local_1a8,(ulong)(local_1f0->_M_dataplus)._M_p);
  std::__cxx11::string::append(local_1a8);
  cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1a8);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
switchD_0030f578_default:
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkFlags = this->Makefile->GetSafeDefinition(linkFlagsVar);
    }
  }
  return linkFlags;
}